

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberParser.h
# Opt level: O0

IntResult * __thiscall
slang::parsing::NumberParser::parseInteger<slang::parsing::Preprocessor,true>
          (IntResult *__return_storage_ptr__,NumberParser *this,Preprocessor *stream)

{
  Token first_00;
  Token base;
  Token size;
  Token token_00;
  Token baseToken_00;
  Token sizeToken_00;
  Token baseToken_01;
  Token sizeToken_01;
  undefined2 kind;
  undefined1 auVar1 [8];
  undefined8 uVar2;
  Info *pIVar3;
  Info *pIVar4;
  bool bVar5;
  Token TVar6;
  Token TVar7;
  bool local_1e9;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> local_190;
  Token local_180;
  undefined1 local_170 [16];
  Token local_160;
  undefined1 local_150 [20];
  int local_13c;
  SourceLocation SStack_138;
  int index;
  undefined1 local_130 [8];
  Token next;
  int count;
  undefined1 local_e8 [8];
  Token first;
  Info *local_d0;
  Info *local_88;
  Info *local_80;
  undefined1 local_78 [8];
  anon_class_16_2_049d3a7c createSimple;
  undefined1 local_48 [8];
  Token token;
  Token baseToken;
  Token sizeToken;
  Preprocessor *stream_local;
  NumberParser *this_local;
  
  Token::Token((Token *)&baseToken.info);
  Token::Token((Token *)&token.info);
  TVar6 = Preprocessor::consume(stream);
  local_48._0_2_ = TVar6.kind;
  _local_48 = TVar6;
  if (local_48._0_2_ == IntegerBase) {
    local_48 = TVar6._0_8_;
    token.info = (Info *)local_48;
    token._0_8_ = TVar6.info;
    baseToken.kind = token.kind;
    baseToken._2_1_ = token._2_1_;
    baseToken.numFlags.raw = token.numFlags.raw;
    baseToken.rawLen = token.rawLen;
    Token::Token((Token *)&createSimple.this);
    startVector(this,TVar6,stack0xffffffffffffff98);
  }
  else {
    local_78 = (undefined1  [8])local_48;
    createSimple.token = (Token *)this;
    bVar5 = Preprocessor::peekSameLine(stream);
    if (!bVar5) {
      parseInteger<slang::parsing::Preprocessor,_true>::anon_class_16_2_049d3a7c::operator()
                (__return_storage_ptr__,(anon_class_16_2_049d3a7c *)local_78);
      return __return_storage_ptr__;
    }
    bVar5 = Preprocessor::peek(stream,IntegerBase);
    TVar6 = _local_48;
    if (!bVar5) {
      parseInteger<slang::parsing::Preprocessor,_true>::anon_class_16_2_049d3a7c::operator()
                (__return_storage_ptr__,(anon_class_16_2_049d3a7c *)local_78);
      return __return_storage_ptr__;
    }
    baseToken.info = (Info *)local_48;
    uVar2 = token._0_8_;
    sizeToken.kind = token.kind;
    sizeToken._2_1_ = token._2_1_;
    sizeToken.numFlags.raw = token.numFlags.raw;
    sizeToken.rawLen = token.rawLen;
    _local_48 = TVar6;
    TVar7 = Preprocessor::consume(stream);
    local_88 = TVar7._0_8_;
    token.info = local_88;
    local_80 = TVar7.info;
    baseToken._0_8_ = local_80;
    TVar6.info = (Info *)uVar2;
    TVar6._0_8_ = baseToken.info;
    startVector(this,TVar7,TVar6);
  }
  bVar5 = Preprocessor::peekSameLine(stream);
  pIVar4 = baseToken.info;
  uVar2 = baseToken._0_8_;
  pIVar3 = token.info;
  if (bVar5) {
    _local_e8 = Preprocessor::peek(stream);
    bVar5 = slang::syntax::SyntaxFacts::isPossibleVectorDigit(local_e8._0_2_);
    TVar6 = _local_e8;
    if (bVar5) {
      next.info._4_4_ = 0;
      local_130 = local_e8;
      next.kind = first.kind;
      next._2_1_ = first._2_1_;
      next.numFlags.raw = first.numFlags.raw;
      next.rawLen = first.rawLen;
      _local_e8 = TVar6;
      SStack_138 = Token::location((Token *)local_e8);
      this->firstLocation = SStack_138;
      do {
        next.info._4_4_ = next.info._4_4_ + 1;
        local_150._0_8_ = local_130;
        local_150._8_2_ = next.kind;
        local_150[10] = next._2_1_;
        local_150[0xb] = next.numFlags.raw;
        local_150._12_4_ = next.rawLen;
        TVar7.info = (Info *)next._0_8_;
        TVar7.kind = local_130._0_2_;
        TVar7._2_1_ = local_130[2];
        TVar7.numFlags.raw = local_130[3];
        TVar7.rawLen = local_130._4_4_;
        local_13c = append(this,TVar7,next.info._4_4_ == 1);
        local_160 = Preprocessor::consume(stream);
        if (-1 < local_13c) {
          local_170._0_8_ = local_130;
          local_170._8_2_ = next.kind;
          local_170[10] = next._2_1_;
          local_170[0xb] = next.numFlags.raw;
          local_170._12_4_ = next.rawLen;
          token_00.info = (Info *)next._0_8_;
          token_00.kind = local_130._0_2_;
          token_00._2_1_ = local_130[2];
          token_00.numFlags.raw = local_130[3];
          token_00.rawLen = local_130._4_4_;
          Preprocessor::handleExponentSplit(stream,token_00,(long)local_13c);
          next.info._4_4_ = next.info._4_4_ + 1;
          break;
        }
        bVar5 = Preprocessor::peekSameLine(stream);
        if (!bVar5) break;
        TVar6 = Preprocessor::peek(stream);
        local_180._0_8_ = TVar6._0_8_;
        local_130._0_2_ = local_180.kind;
        local_130[2] = local_180._2_1_;
        local_130[3] = local_180.numFlags.raw;
        local_130._4_4_ = local_180.rawLen;
        auVar1 = local_130;
        local_180.info = TVar6.info;
        next._0_8_ = local_180.info;
        local_130._0_2_ = TVar6.kind;
        kind = local_130._0_2_;
        local_180 = TVar6;
        local_130 = auVar1;
        bVar5 = slang::syntax::SyntaxFacts::isPossibleVectorDigit(kind);
        local_1e9 = false;
        if (bVar5) {
          local_190 = Token::trivia((Token *)local_130);
          local_1e9 = nonstd::span_lite::span<const_slang::parsing::Trivia,_18446744073709551615UL>
                      ::empty(&local_190);
        }
      } while (local_1e9 != false);
      pIVar4 = baseToken.info;
      uVar2 = baseToken._0_8_;
      pIVar3 = token.info;
      TVar6 = finishValue(this,_local_e8,next.info._4_4_ == 1);
      size.info = (Info *)sizeToken._0_8_;
      size._0_8_ = pIVar4;
      base.info = (Info *)uVar2;
      base._0_8_ = pIVar3;
      IntResult::vector(__return_storage_ptr__,size,base,TVar6);
    }
    else {
      sizeToken_00.info = (Info *)sizeToken._0_8_;
      sizeToken_00._0_8_ = baseToken.info;
      baseToken_00.info = (Info *)baseToken._0_8_;
      baseToken_00._0_8_ = token.info;
      reportMissingDigits(__return_storage_ptr__,this,sizeToken_00,baseToken_00,_local_e8);
    }
  }
  else {
    Token::Token((Token *)&first.info);
    sizeToken_01.info = (Info *)sizeToken._0_8_;
    sizeToken_01._0_8_ = pIVar4;
    baseToken_01.info = (Info *)uVar2;
    baseToken_01._0_8_ = pIVar3;
    first_00.info = local_d0;
    first_00._0_8_ = first.info;
    reportMissingDigits(__return_storage_ptr__,this,sizeToken_01,baseToken_01,first_00);
  }
  return __return_storage_ptr__;
}

Assistant:

IntResult parseInteger(TStream& stream) {
        Token sizeToken;
        Token baseToken;

        auto token = stream.consume();
        if (token.kind == TokenKind::IntegerBase) {
            baseToken = token;
            startVector(baseToken, Token());
        }
        else {
            auto createSimple = [&] {
                if (token.intValue() > INT32_MAX)
                    reportIntOverflow(token);
                return IntResult::simple(token);
            };

            if constexpr (RequireSameLine) {
                if (!stream.peekSameLine())
                    return createSimple();
            }

            if (!stream.peek(TokenKind::IntegerBase))
                return createSimple();

            sizeToken = token;
            baseToken = stream.consume();
            startVector(baseToken, sizeToken);
        }

        if constexpr (RequireSameLine) {
            if (!stream.peekSameLine())
                return reportMissingDigits(sizeToken, baseToken, Token());
        }

        // At this point we expect to see vector digits, but they could be split out into other
        // token types because of hex literals.
        auto first = stream.peek();
        if (!syntax::SyntaxFacts::isPossibleVectorDigit(first.kind))
            return reportMissingDigits(sizeToken, baseToken, first);

        int count = 0;
        Token next = first;
        firstLocation = first.location();

        do {
            count++;
            int index = append(next, count == 1);
            stream.consume();

            if (index >= 0) {
                // This handles a really obnoxious case: 'h 3e+2
                // The second token is initially lexed as a real literal, but we need to split
                // it apart here now that we know it's a hex literal and put the remaining (new)
                // tokens back on the parser's stack.
                stream.handleExponentSplit(next, (size_t)index);

                // Bump the count so that we definitely take the modified raw text
                // instead of trying to use the initial token's raw directly.
                count++;
                break;
            }

            if constexpr (RequireSameLine) {
                if (!stream.peekSameLine())
                    break;
            }

            next = stream.peek();
        } while (syntax::SyntaxFacts::isPossibleVectorDigit(next.kind) && next.trivia().empty());

        return IntResult::vector(sizeToken, baseToken, finishValue(first, count == 1));
    }